

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O2

string * __thiscall
testing::internal::StreamableToString<wchar_t*>
          (string *__return_storage_ptr__,internal *this,wchar_t **streamable)

{
  Message *this_00;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  Message::Message((Message *)&local_20);
  this_00 = Message::operator<<((Message *)&local_20,*(wchar_t **)this);
  Message::GetString_abi_cxx11_(__return_storage_ptr__,this_00);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}